

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O3

int anon_unknown.dwarf_26278::ChannelOut_omni(lua_State *L)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  char local_1b;
  byte local_1a;
  undefined1 local_19;
  
  plVar3 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  lVar1 = plVar3[1];
  iVar2 = lua_toboolean(L,2);
  local_1b = (char)lVar1 + -0x50;
  local_1a = iVar2 == 0 ^ 0x7d;
  local_19 = 0;
  (**(code **)(**(long **)(*plVar3 + 8) + 0x58))(*(long **)(*plVar3 + 8),&local_1b,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_omni(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, lua_toboolean(L, 2) ? 0x7D : 0x7C, 0x00);
	lua_settop(L, 1);
	return 1;
}